

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relu.cpp
# Opt level: O0

int __thiscall ncnn::ReLU::forward_inplace(ReLU *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  long in_RSI;
  long in_RDI;
  int i_1;
  float *ptr_1;
  int q_1;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int d;
  int h;
  int w;
  int in_stack_ffffffffffffff14;
  Mat *in_stack_ffffffffffffff18;
  int local_94;
  int local_90;
  Mat local_80;
  float *local_38;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  local_1c = *(int *)(in_RSI + 0x2c);
  local_20 = *(int *)(in_RSI + 0x30);
  local_24 = *(int *)(in_RSI + 0x34);
  local_28 = *(int *)(in_RSI + 0x38);
  local_2c = local_1c * local_20 * local_24;
  if ((*(float *)(in_RDI + 0xd0) != 0.0) || (NAN(*(float *)(in_RDI + 0xd0)))) {
    for (local_94 = 0; local_94 < local_28; local_94 = local_94 + 1) {
      ncnn::Mat::channel(in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
      pfVar1 = ncnn::Mat::operator_cast_to_float_((Mat *)&stack0xffffffffffffff18);
      ncnn::Mat::~Mat((Mat *)0x4f06a3);
      for (in_stack_ffffffffffffff14 = 0; in_stack_ffffffffffffff14 < local_2c;
          in_stack_ffffffffffffff14 = in_stack_ffffffffffffff14 + 1) {
        if (pfVar1[in_stack_ffffffffffffff14] <= 0.0 && pfVar1[in_stack_ffffffffffffff14] != 0.0) {
          pfVar1[in_stack_ffffffffffffff14] =
               *(float *)(in_RDI + 0xd0) * pfVar1[in_stack_ffffffffffffff14];
        }
      }
    }
  }
  else {
    for (local_30 = 0; local_30 < local_28; local_30 = local_30 + 1) {
      ncnn::Mat::channel(in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
      pfVar1 = ncnn::Mat::operator_cast_to_float_(&local_80);
      ncnn::Mat::~Mat((Mat *)0x4f059a);
      for (local_90 = 0; local_90 < local_2c; local_90 = local_90 + 1) {
        if (pfVar1[local_90] <= 0.0 && pfVar1[local_90] != 0.0) {
          pfVar1[local_90] = 0.0;
        }
      }
      local_38 = pfVar1;
    }
  }
  return 0;
}

Assistant:

int ReLU::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;

    if (slope == 0.f)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] = 0;
            }
        }
    }
    else
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    return 0;
}